

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void send_authorization_request(mg_connection *conn,char *realm)

{
  long lVar1;
  ulong uVar2;
  char *http1_headers;
  mg_domain_context *pmVar3;
  mg_context *pmVar4;
  ulong uVar5;
  int trunc;
  char buf [128];
  int local_ac;
  char local_a8 [136];
  
  pmVar4 = conn->phys_ctx;
  lVar1 = pmVar4->start_time;
  local_ac = 0;
  if (realm == (char *)0x0) {
    realm = conn->dom_ctx->config[0x1e];
  }
  if (pmVar4->context_type == 1) {
    pthread_mutex_lock((pthread_mutex_t *)&pmVar4->nonce_mutex);
    pmVar4 = conn->phys_ctx;
    pmVar3 = conn->dom_ctx;
    uVar5 = lVar1 + pmVar3->nonce_count;
    pmVar3->nonce_count = pmVar3->nonce_count + 1;
    if (pmVar4 == (mg_context *)0x0) goto LAB_0010fa5e;
  }
  else {
    pmVar3 = conn->dom_ctx;
    uVar5 = lVar1 + pmVar3->nonce_count;
    pmVar3->nonce_count = pmVar3->nonce_count + 1;
  }
  if (pmVar4->context_type == 1) {
    pthread_mutex_unlock((pthread_mutex_t *)&pmVar4->nonce_mutex);
    pmVar3 = conn->dom_ctx;
  }
LAB_0010fa5e:
  uVar2 = pmVar3->auth_nonce_mask;
  conn->must_close = 1;
  mg_response_header_start(conn,0x191);
  send_no_cache_header(conn);
  http1_headers = conn->dom_ctx->config[0x38];
  if ((http1_headers != (char *)0x0) && (*http1_headers != '\0')) {
    mg_response_header_add_lines(conn,http1_headers);
  }
  mg_response_header_add(conn,"Content-Length","0",-1);
  mg_snprintf(conn,&local_ac,local_a8,0x80,"Digest qop=\"auth\", realm=\"%s\", nonce=\"%lu\"",realm,
              uVar5 ^ uVar2);
  if (local_ac == 0) {
    mg_response_header_add(conn,"WWW-Authenticate",local_a8,-1);
  }
  mg_response_header_send(conn);
  return;
}

Assistant:

static void
send_authorization_request(struct mg_connection *conn, const char *realm)
{
	uint64_t nonce = (uint64_t)(conn->phys_ctx->start_time);
	int trunc = 0;
	char buf[128];

	if (!realm) {
		realm = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	mg_lock_context(conn->phys_ctx);
	nonce += conn->dom_ctx->nonce_count;
	++conn->dom_ctx->nonce_count;
	mg_unlock_context(conn->phys_ctx);

	nonce ^= conn->dom_ctx->auth_nonce_mask;
	conn->must_close = 1;

	/* Create 401 response */
	mg_response_header_start(conn, 401);
	send_no_cache_header(conn);
	send_additional_header(conn);
	mg_response_header_add(conn, "Content-Length", "0", -1);

	/* Content for "WWW-Authenticate" header */
	mg_snprintf(conn,
	            &trunc,
	            buf,
	            sizeof(buf),
	            "Digest qop=\"auth\", realm=\"%s\", "
	            "nonce=\"%" UINT64_FMT "\"",
	            realm,
	            nonce);

	if (!trunc) {
		/* !trunc should always be true */
		mg_response_header_add(conn, "WWW-Authenticate", buf, -1);
	}

	/* Send all headers */
	mg_response_header_send(conn);
}